

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

char * ImGui::GetKeyName(ImGuiKey key)

{
  bool bVar1;
  ImGuiIO *pIVar2;
  ImGuiKey in_EDI;
  ImGuiIO *io;
  ImGuiKey local_c;
  char *local_8;
  
  bVar1 = IsLegacyKey(in_EDI);
  local_c = in_EDI;
  if (bVar1) {
    pIVar2 = GetIO();
    if (pIVar2->KeyMap[(int)in_EDI] == -1) {
      local_8 = "N/A";
      return local_8;
    }
    local_c = pIVar2->KeyMap[(int)in_EDI];
  }
  if (local_c == ImGuiKey_KeysData_OFFSET) {
    local_8 = "None";
  }
  else {
    if ((local_c & ImGuiMod_Mask_) != ImGuiKey_KeysData_OFFSET) {
      local_c = ConvertSingleModFlagToKey(local_c);
    }
    bVar1 = IsNamedKey(local_c);
    if (bVar1) {
      local_8 = GKeyNames[(int)(local_c - ImGuiKey_NamedKey_BEGIN)];
    }
    else {
      local_8 = "Unknown";
    }
  }
  return local_8;
}

Assistant:

const char* ImGui::GetKeyName(ImGuiKey key)
{
#ifdef IMGUI_DISABLE_OBSOLETE_KEYIO
    IM_ASSERT((IsNamedKey(key) || key == ImGuiKey_None) && "Support for user key indices was dropped in favor of ImGuiKey. Please update backend and user code.");
#else
    if (IsLegacyKey(key))
    {
        ImGuiIO& io = GetIO();
        if (io.KeyMap[key] == -1)
            return "N/A";
        IM_ASSERT(IsNamedKey((ImGuiKey)io.KeyMap[key]));
        key = (ImGuiKey)io.KeyMap[key];
    }
#endif
    if (key == ImGuiKey_None)
        return "None";
    if (key & ImGuiMod_Mask_)
        key = ConvertSingleModFlagToKey(key);
    if (!IsNamedKey(key))
        return "Unknown";

    return GKeyNames[key - ImGuiKey_NamedKey_BEGIN];
}